

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QHash<int,_QVariant>_>::resize(QList<QHash<int,_QVariant>_> *this,qsizetype size)

{
  qsizetype qVar1;
  QArrayDataPointer<QHash<int,_QVariant>_> *in_RSI;
  QArrayDataPointer<QHash<int,_QVariant>_> *in_RDI;
  QList<QHash<int,_QVariant>_> *unaff_retaddr;
  QArrayDataPointer<QHash<int,_QVariant>_> *this_00;
  
  resize_internal(unaff_retaddr,(qsizetype)in_RDI);
  this_00 = in_RSI;
  qVar1 = QList<QHash<int,_QVariant>_>::size((QList<QHash<int,_QVariant>_> *)in_RDI);
  if (qVar1 < (long)in_RSI) {
    QArrayDataPointer<QHash<int,_QVariant>_>::operator->(in_RDI);
    QArrayDataPointer<QHash<int,_QVariant>_>::appendInitialize(this_00,(qsizetype)in_RSI);
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }